

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall iu_Matcher_x_iutest_x_Property_Test::Body(iu_Matcher_x_iutest_x_Property_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  code *pcVar5;
  _Rb_tree_node_base *p_Var6;
  AssertionResult *pAVar7;
  X *in_RDX;
  map<int,_(anonymous_namespace)::X,_std::less<int>,_std::allocator<std::pair<const_int,_(anonymous_namespace)::X>_>_>
  *v;
  iutest *this_00;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  AssertionResult iutest_ar_2;
  undefined1 local_420 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  char *local_400;
  undefined8 local_3f8;
  AssertionResult local_3f0;
  AssertionResult local_3c8;
  detail *local_3a0;
  undefined8 local_398;
  detail local_390;
  undefined7 uStack_38f;
  byte local_380;
  string local_378;
  int local_358 [2];
  undefined1 local_350 [8];
  undefined **local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  char *local_330;
  undefined8 local_328;
  ios_base local_2d0 [264];
  undefined1 local_1c8 [8];
  undefined8 *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined **local_1a8;
  code **local_1a0;
  GeMatcher<int> local_198 [5];
  ios_base local_148 [264];
  code *local_40;
  undefined8 local_38;
  
  local_1c0 = (undefined8 *)local_350;
  local_350 = (undefined1  [8])anon_unknown.dwarf_613d2::X::GetA;
  local_348 = (undefined **)0x0;
  local_1c8 = (undefined1  [8])&PTR__IMatcher_0023b8c0;
  local_1b8._M_allocated_capacity._0_4_ = 1;
  iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::operator()
            (&local_3f0,(PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *)local_1c8,
             in_RDX);
  if (local_3f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_350,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_350);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c8);
    iutest::detail::PrintBytesInObjectTo
              ((uchar *)&(anonymous_namespace)::gx,8,(iu_ostream *)&local_1b8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
    std::ios_base::~ios_base(local_148);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3c8.m_message,local_3a0,"Property(&X::GetA, 1)",(char *)&local_3f0,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_420,local_3c8.m_message._M_dataplus._M_p,(allocator<char> *)local_1c8
              );
    local_400 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_3f8._0_4_ = 0x170;
    local_3f8._4_4_ = 1;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_420,(Fixed *)local_350,false);
    if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
      operator_delete((void *)local_420._0_8_,
                      CONCAT44(local_410._M_allocated_capacity._4_4_,
                               local_410._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.m_message._M_dataplus._M_p != &local_3c8.m_message.field_2) {
      operator_delete(local_3c8.m_message._M_dataplus._M_p,
                      CONCAT71(local_3c8.m_message.field_2._M_allocated_capacity._1_7_,
                               local_3c8.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_350);
    std::ios_base::~ios_base(local_2d0);
  }
  paVar1 = &local_3f0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0.m_message._M_dataplus._M_p,
                    CONCAT71(local_3f0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_3f0.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_420._8_8_ = &local_3c8;
  local_3c8.m_message._M_dataplus._M_p = (pointer)anon_unknown.dwarf_613d2::X::GetA;
  local_3c8.m_message._M_string_length = 0;
  local_420._0_8_ = &PTR__IMatcher_0023b8c0;
  local_410._M_allocated_capacity._0_4_ = 1;
  local_350 = (undefined1  [8])&PTR__IMatcher_0023c380;
  local_3a0 = (detail *)CONCAT44(local_3a0._4_4_,(anonymous_namespace)::gx);
  local_348 = (undefined **)(local_420 + 0x10);
  iutest::detail::EqMatcher<int>::operator()
            ((AssertionResult *)local_1c8,(EqMatcher<int> *)local_350,(int *)&local_3a0);
  bVar4 = local_1a8._0_1_;
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
  }
  local_3f0.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (bVar4 == false) {
    local_1c0 = (undefined8 *)0x0;
    local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8 = (undefined **)((ulong)local_1a8 & 0xffffffffffffff00);
    local_1c8 = (undefined1  [8])&local_1b8;
    iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::WhichIs_abi_cxx11_
              ((string *)local_350,
               (PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *)local_420);
    pAVar7 = iutest::AssertionResult::operator<<
                       ((AssertionResult *)local_1c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_350);
    pcVar2 = (pAVar7->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3f0,pcVar2,pcVar2 + (pAVar7->m_message)._M_string_length);
    local_3f0.m_result = pAVar7->m_result;
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,
                      CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) + 1)
      ;
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
    }
    if ((local_3f0.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_350,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_350);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1c8);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1b8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
      std::ios_base::~ios_base(local_148);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_3c8.m_message,local_3a0,"Property(&X::GetA, 1)",(char *)&local_3f0,in_R8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_420,local_3c8.m_message._M_dataplus._M_p,
                 (allocator<char> *)local_1c8);
      local_400 = 
      "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
      local_3f8._0_4_ = 0x171;
      local_3f8._4_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)local_420,(Fixed *)local_350,false);
      if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
        operator_delete((void *)local_420._0_8_,
                        CONCAT44(local_410._M_allocated_capacity._4_4_,
                                 local_410._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_message._M_dataplus._M_p != &local_3c8.m_message.field_2) {
        operator_delete(local_3c8.m_message._M_dataplus._M_p,
                        CONCAT71(local_3c8.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_3c8.m_message.field_2._M_local_buf[0]) + 1);
      }
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_350);
      std::ios_base::~ios_base(local_2d0);
    }
  }
  else {
    local_3f0.m_message._M_string_length = 0;
    local_3f0.m_message.field_2._M_local_buf[0] = '\0';
    local_3f0.m_result = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0.m_message._M_dataplus._M_p,
                    CONCAT71(local_3f0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_3f0.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._8_8_ = local_358 + 1;
  local_358[1] = 10;
  local_1a0 = &local_40;
  local_40 = anon_unknown.dwarf_613d2::X::GetA;
  local_38 = 0;
  local_198[0].m_expected = local_358;
  local_358[0] = 0;
  local_1c8 = (undefined1  [8])&PTR__EachMatcher_0023b980;
  local_1c0 = &PTR__PairMatcher_0023b940;
  local_1b8._M_allocated_capacity = (size_type)&PTR__IMatcher_0023c7c0;
  local_1a8 = &PTR__PropertyMatcher_0023b900;
  local_198[0].super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_0023c8c0;
  if ((anonymous_namespace)::mx._24_8_ != 0x240958) {
    paVar1 = &local_3c8.m_message.field_2;
    p_Var6 = (_Rb_tree_node_base *)(anonymous_namespace)::mx._24_8_;
    do {
      iutest::detail::LeMatcher<int>::operator()
                ((AssertionResult *)local_350,(LeMatcher<int> *)&local_1b8,(int *)(p_Var6 + 1));
      bVar4 = local_330._0_1_;
      if (local_350 != (undefined1  [8])&local_340) {
        operator_delete((void *)local_350,
                        CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) +
                        1);
      }
      if (bVar4 == false) {
        local_348 = (undefined **)0x0;
        local_340._M_local_buf[0] = '\0';
        local_330 = (char *)((ulong)local_330 & 0xffffffffffffff00);
        local_350 = (undefined1  [8])&local_340;
        iutest::detail::
        PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>
        ::WhichIs_abi_cxx11_((string *)local_420,&local_1c0);
        pAVar7 = iutest::AssertionResult::operator<<
                           ((AssertionResult *)local_350,(string *)local_420);
        pcVar2 = (pAVar7->m_message)._M_dataplus._M_p;
        local_3c8.m_message._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c8,pcVar2,pcVar2 + (pAVar7->m_message)._M_string_length);
LAB_00187e1a:
        local_3c8.m_result = pAVar7->m_result;
        if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
          operator_delete((void *)local_420._0_8_,
                          CONCAT44(local_410._M_allocated_capacity._4_4_,
                                   local_410._M_allocated_capacity._0_4_) + 1);
        }
        if (local_350 != (undefined1  [8])&local_340) {
          operator_delete((void *)local_350,
                          CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0])
                          + 1);
        }
      }
      else {
        pcVar5 = *local_1a0;
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *(long *)(&p_Var6[1].field_0x4 + (long)local_1a0[1]) + -1);
        }
        local_378._M_dataplus._M_p._0_4_ = (*pcVar5)();
        iutest::detail::GeMatcher<int>::operator()
                  ((AssertionResult *)local_350,local_198,(int *)&local_378);
        bVar4 = local_330._0_1_;
        if (local_350 != (undefined1  [8])&local_340) {
          operator_delete((void *)local_350,
                          CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0])
                          + 1);
        }
        if (bVar4 == false) {
          local_348 = (undefined **)0x0;
          local_340._M_local_buf[0] = '\0';
          local_330 = (char *)((ulong)local_330 & 0xffffffffffffff00);
          local_350 = (undefined1  [8])&local_340;
          iutest::detail::
          PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>::
          WhichIs_abi_cxx11_(&local_378,&local_1a8);
          pAVar7 = iutest::AssertionResult::operator<<((AssertionResult *)local_350,&local_378);
          local_420._0_8_ = local_420 + 0x10;
          pcVar2 = (pAVar7->m_message)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_420,pcVar2,pcVar2 + (pAVar7->m_message)._M_string_length);
          local_400 = (char *)CONCAT71(local_400._1_7_,pAVar7->m_result);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_378._M_dataplus._M_p._4_4_,local_378._M_dataplus._M_p._0_4_) !=
              &local_378.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_378._M_dataplus._M_p._4_4_,
                                     local_378._M_dataplus._M_p._0_4_),
                            local_378.field_2._M_allocated_capacity + 1);
          }
          if (local_350 != (undefined1  [8])&local_340) {
            operator_delete((void *)local_350,
                            CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]
                                    ) + 1);
          }
          pcVar3 = local_400;
          if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
            operator_delete((void *)local_420._0_8_,
                            CONCAT44(local_410._M_allocated_capacity._4_4_,
                                     local_410._M_allocated_capacity._0_4_) + 1);
          }
          if (((ulong)pcVar3 & 1) == 0) {
            local_348 = (undefined **)0x0;
            local_340._M_local_buf[0] = '\0';
            local_330 = (char *)((ulong)local_330 & 0xffffffffffffff00);
            local_350 = (undefined1  [8])&local_340;
            iutest::detail::
            PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>
            ::WhichIs_abi_cxx11_((string *)local_420,&local_1c0);
            pAVar7 = iutest::AssertionResult::operator<<
                               ((AssertionResult *)local_350,(string *)local_420);
            pcVar2 = (pAVar7->m_message)._M_dataplus._M_p;
            local_3c8.m_message._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3c8,pcVar2,pcVar2 + (pAVar7->m_message)._M_string_length);
            goto LAB_00187e1a;
          }
        }
        local_3c8.m_message._M_string_length = 0;
        local_3c8.m_message.field_2._M_local_buf[0] = '\0';
        local_3c8.m_result = true;
        local_3c8.m_message._M_dataplus._M_p = (pointer)paVar1;
      }
      iutest::AssertionResult::operator!(&local_3f0,&local_3c8);
      bVar4 = local_3f0.m_result;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0.m_message._M_dataplus._M_p != &local_3f0.m_message.field_2) {
        operator_delete(local_3f0.m_message._M_dataplus._M_p,
                        CONCAT71(local_3f0.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_3f0.m_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c8.m_message._M_dataplus._M_p,
                        CONCAT71(local_3c8.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_3c8.m_message.field_2._M_local_buf[0]) + 1);
      }
      if (bVar4 != false) {
        local_348 = (undefined **)0x0;
        local_340._M_local_buf[0] = '\0';
        local_330 = (char *)((ulong)local_330 & 0xffffffffffffff00);
        local_350 = (undefined1  [8])&local_340;
        iutest::detail::
        EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>>
        ::WhichIs_abi_cxx11_((string *)local_420,local_1c8);
        pAVar7 = iutest::AssertionResult::operator<<
                           ((AssertionResult *)local_350,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_420);
        local_3a0 = &local_390;
        pcVar2 = (pAVar7->m_message)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a0,pcVar2,pcVar2 + (pAVar7->m_message)._M_string_length);
        local_380 = pAVar7->m_result;
        if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
          operator_delete((void *)local_420._0_8_,
                          CONCAT44(local_410._M_allocated_capacity._4_4_,
                                   local_410._M_allocated_capacity._0_4_) + 1);
        }
        if (local_350 != (undefined1  [8])&local_340) {
          operator_delete((void *)local_350,
                          CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0])
                          + 1);
        }
        if ((local_380 & 1) == 0) {
          this_00 = (iutest *)0x0;
          memset((iu_global_format_stringstream *)local_1c8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_1c8);
          iutest::
          PrintToString<std::map<int,(anonymous_namespace)::X,std::less<int>,std::allocator<std::pair<int_const,(anonymous_namespace)::X>>>>
                    (&local_3f0.m_message,this_00,v);
          iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                    ((string *)local_420,(detail *)local_3f0.m_message._M_dataplus._M_p,
                     "Each(Pair(Le(10), Property(&X::GetA, Ge(0))))",(char *)&local_3a0,in_R8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_350,(char *)local_420._0_8_,(allocator<char> *)&local_3c8);
          local_330 = 
          "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
          ;
          local_328 = 0x100000173;
          iutest::AssertionHelper::OnFixed((AssertionHelper *)local_350,(Fixed *)local_1c8,false);
          if (local_350 != (undefined1  [8])&local_340) {
            operator_delete((void *)local_350,
                            CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
            operator_delete((void *)local_420._0_8_,
                            CONCAT44(local_410._M_allocated_capacity._4_4_,
                                     local_410._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0.m_message._M_dataplus._M_p != &local_3f0.m_message.field_2) {
            operator_delete(local_3f0.m_message._M_dataplus._M_p,
                            CONCAT71(local_3f0.m_message.field_2._M_allocated_capacity._1_7_,
                                     local_3f0.m_message.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
          std::ios_base::~ios_base(local_148);
        }
        goto LAB_00187e82;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)((anonymous_namespace)::mx + 8));
  }
  local_3a0 = &local_390;
  local_398 = 0;
  local_390 = (detail)0x0;
  local_380 = 1;
LAB_00187e82:
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
  }
  return;
}

Assistant:

IUTEST(Matcher, Property)
{
    IUTEST_EXPECT_THAT( gx, Property(&X::GetA, 1));
    IUTEST_EXPECT_THAT(&gx, Property(&X::GetA, 1));
#if IUTEST_HAS_MATCHER_EACH
    IUTEST_EXPECT_THAT( mx, Each(Pair(Le(10), Property(&X::GetA, Ge(0)))));
#endif
}